

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::ExternalInterface::store
          (ExternalInterface *this,Store *store,Address addr,Literal *value,Name memory)

{
  char cVar1;
  uint16_t uVar2;
  BasicType BVar3;
  int32_t iVar4;
  uint uVar5;
  ulong uVar6;
  int64_t iVar7;
  _Type local_148;
  char *local_138;
  ExternalInterface *local_130;
  size_t local_128;
  char *local_120;
  ExternalInterface *local_118;
  size_t local_110;
  char *local_108;
  ExternalInterface *local_100;
  size_t local_f8;
  char *local_f0;
  int32_t local_e8;
  float local_e4;
  ExternalInterface *pEStack_e0;
  float f32;
  size_t local_d8;
  char *local_d0;
  ExternalInterface *local_c8;
  size_t local_c0;
  char *local_b8;
  ExternalInterface *local_b0;
  size_t local_a8;
  char *local_a0;
  ExternalInterface *local_98;
  size_t local_90;
  char *local_88;
  ExternalInterface *local_80;
  size_t local_78;
  char *local_70;
  ExternalInterface *local_68;
  size_t local_60;
  char *local_58;
  ExternalInterface *local_50;
  size_t local_48;
  char *local_40;
  Literal *local_38;
  Literal *value_local;
  Store *store_local;
  ExternalInterface *this_local;
  Name memory_local;
  Address addr_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  this_local = memory.super_IString.str._M_len;
  local_38 = value;
  value_local = (Literal *)store;
  store_local = (Store *)this;
  memory_local.super_IString.str._M_str = (char *)addr.addr;
  BVar3 = wasm::Type::getBasic(&store->valueType);
  switch(BVar3) {
  case none:
  case unreachable:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                       ,0xb56);
  case i32:
    cVar1 = (char)(value_local->type).id;
    if (cVar1 == '\x01') {
      local_40 = memory_local.super_IString.str._M_str;
      iVar4 = wasm::Literal::geti32(value);
      local_50 = this_local;
      local_48 = memory_local.super_IString.str._M_len;
      (*this->_vptr_ExternalInterface[0x16])
                (this,local_40,(ulong)(uint)(int)(char)iVar4,this_local,
                 memory_local.super_IString.str._M_len);
    }
    else if (cVar1 == '\x02') {
      local_58 = memory_local.super_IString.str._M_str;
      iVar4 = wasm::Literal::geti32(value);
      local_68 = this_local;
      local_60 = memory_local.super_IString.str._M_len;
      (*this->_vptr_ExternalInterface[0x17])
                (this,local_58,(ulong)(uint)(int)(short)iVar4,this_local,
                 memory_local.super_IString.str._M_len);
    }
    else {
      if (cVar1 != '\x04') {
        handle_unreachable("invalid store size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0xb25);
      }
      local_70 = memory_local.super_IString.str._M_str;
      uVar5 = wasm::Literal::geti32(value);
      local_80 = this_local;
      local_78 = memory_local.super_IString.str._M_len;
      (*this->_vptr_ExternalInterface[0x18])
                (this,local_70,(ulong)uVar5,this_local,memory_local.super_IString.str._M_len);
    }
    break;
  case i64:
    switch((char)(value_local->type).id) {
    case '\x01':
      local_88 = memory_local.super_IString.str._M_str;
      iVar7 = wasm::Literal::geti64(value);
      local_98 = this_local;
      local_90 = memory_local.super_IString.str._M_len;
      (*this->_vptr_ExternalInterface[0x16])
                (this,local_88,(ulong)(uint)(int)(char)iVar7,this_local,
                 memory_local.super_IString.str._M_len);
      break;
    case '\x02':
      local_a0 = memory_local.super_IString.str._M_str;
      iVar7 = wasm::Literal::geti64(value);
      local_b0 = this_local;
      local_a8 = memory_local.super_IString.str._M_len;
      (*this->_vptr_ExternalInterface[0x17])
                (this,local_a0,(ulong)(uint)(int)(short)iVar7,this_local,
                 memory_local.super_IString.str._M_len);
      break;
    default:
      handle_unreachable("invalid store size",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                         ,0xb38);
    case '\x04':
      local_b8 = memory_local.super_IString.str._M_str;
      uVar6 = wasm::Literal::geti64(value);
      local_c8 = this_local;
      local_c0 = memory_local.super_IString.str._M_len;
      (*this->_vptr_ExternalInterface[0x18])
                (this,local_b8,uVar6 & 0xffffffff,this_local,memory_local.super_IString.str._M_len);
      break;
    case '\b':
      local_d0 = memory_local.super_IString.str._M_str;
      iVar7 = wasm::Literal::geti64(value);
      pEStack_e0 = this_local;
      local_d8 = memory_local.super_IString.str._M_len;
      (*this->_vptr_ExternalInterface[0x19])
                (this,local_d0,iVar7,this_local,memory_local.super_IString.str._M_len);
    }
    break;
  case f32:
    cVar1 = (char)(value_local->type).id;
    if (cVar1 == '\x02') {
      local_e8 = wasm::Literal::reinterpreti32(value);
      local_e4 = bit_cast<float,int>(&local_e8);
      local_f0 = memory_local.super_IString.str._M_str;
      uVar2 = fp16_ieee_from_fp32_value(local_e4);
      local_100 = this_local;
      local_f8 = memory_local.super_IString.str._M_len;
      (*this->_vptr_ExternalInterface[0x17])
                (this,local_f0,(ulong)(uint)(int)(short)uVar2,this_local,
                 memory_local.super_IString.str._M_len);
    }
    else {
      if (cVar1 != '\x04') {
        handle_unreachable("invalid store size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0xb4a);
      }
      local_108 = memory_local.super_IString.str._M_str;
      uVar5 = wasm::Literal::reinterpreti32(value);
      local_118 = this_local;
      local_110 = memory_local.super_IString.str._M_len;
      (*this->_vptr_ExternalInterface[0x18])
                (this,local_108,(ulong)uVar5,this_local,memory_local.super_IString.str._M_len);
    }
    break;
  case f64:
    local_120 = memory_local.super_IString.str._M_str;
    iVar7 = wasm::Literal::reinterpreti64(value);
    local_130 = this_local;
    local_128 = memory_local.super_IString.str._M_len;
    (*this->_vptr_ExternalInterface[0x19])
              (this,local_120,iVar7,this_local,memory_local.super_IString.str._M_len);
    break;
  case v128:
    local_138 = memory_local.super_IString.str._M_str;
    local_148 = (_Type)wasm::Literal::getv128(value);
    (*this->_vptr_ExternalInterface[0x1a])
              (this,local_138,local_148,this_local,memory_local.super_IString.str._M_len);
  }
  return;
}

Assistant:

virtual void store(Store* store, Address addr, Literal value, Name memory) {
      switch (store->valueType.getBasic()) {
        case Type::i32: {
          switch (store->bytes) {
            case 1:
              store8(addr, value.geti32(), memory);
              break;
            case 2:
              store16(addr, value.geti32(), memory);
              break;
            case 4:
              store32(addr, value.geti32(), memory);
              break;
            default:
              WASM_UNREACHABLE("invalid store size");
          }
          break;
        }
        case Type::i64: {
          switch (store->bytes) {
            case 1:
              store8(addr, value.geti64(), memory);
              break;
            case 2:
              store16(addr, value.geti64(), memory);
              break;
            case 4:
              store32(addr, value.geti64(), memory);
              break;
            case 8:
              store64(addr, value.geti64(), memory);
              break;
            default:
              WASM_UNREACHABLE("invalid store size");
          }
          break;
        }
        // write floats carefully, ensuring all bits reach memory
        case Type::f32: {
          switch (store->bytes) {
            case 2: {
              float f32 = bit_cast<float>(value.reinterpreti32());
              // Convert the float32 to float16 and store the binary
              // representation.
              store16(addr, fp16_ieee_from_fp32_value(f32), memory);
              break;
            }
            case 4:
              store32(addr, value.reinterpreti32(), memory);
              break;
            default:
              WASM_UNREACHABLE("invalid store size");
          }
          break;
        }
        case Type::f64:
          store64(addr, value.reinterpreti64(), memory);
          break;
        case Type::v128:
          store128(addr, value.getv128(), memory);
          break;
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
    }